

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
join_function::evaluate
          (join_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_reference pvVar4;
  reference pbVar5;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  optional<unsigned_long> oVar6;
  const_array_range_type cVar7;
  type tVar8;
  type sv;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  bool is_first;
  string_type buf;
  string_type sep;
  reference arg1;
  reference arg0;
  string *in_stack_fffffffffffffe88;
  assertion_error *in_stack_fffffffffffffe90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe98;
  jmespath_errc __e;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffea0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  allocator<char> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  type local_110;
  undefined4 local_fc;
  reference local_f8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_f0;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_e8;
  const_array_range_type local_e0;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_d0;
  byte local_c1;
  string local_c0 [32];
  string local_a0 [32];
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_80;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_78;
  undefined1 local_6d;
  _Storage<unsigned_long,_true> local_38;
  undefined1 local_30;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  reference local_8;
  
  local_18 = in_RSI;
  sVar2 = std::
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RSI);
  oVar6 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::arity(in_RDI);
  local_38._M_value =
       oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_30 = oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar3 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4d6f9c);
  if (sVar2 != *puVar3) {
    local_6d = 1;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    assertion_error::assertion_error(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    local_6d = 0;
    __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar4 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](local_18,0);
  local_78 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ::value(pvVar4);
  pvVar4 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](local_18,1);
  local_80 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
             ::value(pvVar4);
  pvVar4 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](local_18,0);
  bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
          is_value(pvVar4);
  if (bVar1) {
    pvVar4 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,1);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            is_value(pvVar4);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (in_stack_fffffffffffffea8);
      if (!bVar1) {
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffffea0,
                   (jmespath_errc)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::null_value(in_stack_fffffffffffffea0);
        return pbVar5;
      }
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        (in_stack_fffffffffffffea8);
      if (!bVar1) {
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffffea0,
                   (jmespath_errc)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::null_value(in_stack_fffffffffffffea0);
        return pbVar5;
      }
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe98);
      std::__cxx11::string::string(local_c0);
      local_c1 = 1;
      cVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI)
      ;
      local_d0 = &local_e0;
      local_e0 = cVar7;
      local_e8._M_current =
           (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
           ::begin(local_d0);
      local_f0 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                 ::end(local_d0);
      tVar8._M_str = (char *)in_stack_fffffffffffffea8;
      tVar8._M_len = in_stack_fffffffffffffeb0;
      do {
        __e = (jmespath_errc)((ulong)in_stack_fffffffffffffe98 >> 0x20);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe90,
                           (__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffe88);
        if (!bVar1) {
          local_8 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                    ::create_json<std::__cxx11::string&>
                              ((eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                                *)cVar7.last_._M_current._M_current,in_stack_fffffffffffffeb8);
LAB_004d73d7:
          local_fc = 1;
          std::__cxx11::string::~string(local_c0);
          std::__cxx11::string::~string(local_a0);
          return local_8;
        }
        local_f8 = __gnu_cxx::
                   __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_e8);
        bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           tVar8._M_str);
        if (!bVar1) {
          std::error_code::operator=((error_code *)in_stack_fffffffffffffea0,__e);
          local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value(in_stack_fffffffffffffea0);
          goto LAB_004d73d7;
        }
        if ((local_c1 & 1) == 0) {
          std::__cxx11::string::append(local_c0);
        }
        else {
          local_c1 = 0;
        }
        tVar8 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
                as<std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           0x4d733d);
        in_stack_fffffffffffffe98 = &local_110;
        local_110 = tVar8;
        in_stack_fffffffffffffea0 =
             (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              *)std::basic_string_view<char,_std::char_traits<char>_>::begin
                          (in_stack_fffffffffffffe98);
        std::basic_string_view<char,_std::char_traits<char>_>::end(in_stack_fffffffffffffe98);
        std::__cxx11::string::append<char_const*,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cVar7.last_._M_current._M_current,(char *)in_stack_fffffffffffffeb8,
                   (char *)tVar8._M_len);
        __gnu_cxx::
        __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::operator++(&local_e8);
      } while( true );
    }
  }
  std::error_code::operator=
            ((error_code *)in_stack_fffffffffffffea0,
             (jmespath_errc)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  pbVar5 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(in_stack_fffffffffffffea0);
  return pbVar5;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                reference arg0 = args[0].value();
                reference arg1 = args[1].value();

                if (!(args[0].is_value() && args[1].is_value()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                if (!arg0.is_string())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (!arg1.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                string_type sep = arg0.template as<string_type>();
                string_type buf;
                bool is_first = true;
                for (auto &j : arg1.array_range())
                {
                    if (!j.is_string())
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }

                    if (is_first)
                    {
                        is_first = false;
                    }
                    else
                    {
                        buf.append(sep);
                    }
                    
                    auto sv = j.template as<string_view_type>();
                    buf.append(sv.begin(), sv.end());
                }
                return *context.create_json(buf);
            }